

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

void __thiscall
ON_Xform::Rotation(ON_Xform *this,double sin_angle,double cos_angle,ON_3dVector axis,
                  ON_3dPoint center)

{
  bool bVar1;
  double dVar2;
  undefined1 local_50 [8];
  ON_3dVector a;
  double one_minus_cos_angle;
  ON_2dVector cs;
  double cos_angle_local;
  double sin_angle_local;
  ON_Xform *this_local;
  
  cs.y = cos_angle;
  memcpy(this,&IdentityTransformation,0x80);
  if ((ABS(sin_angle) < 0.9999999850988388) || (1.490116119385e-08 < ABS(cs.y))) {
    if ((ABS(cs.y) < 0.9999999850988388) || (1.490116119385e-08 < ABS(sin_angle))) {
      cos_angle_local = sin_angle;
      if (1.490116119385e-08 < ABS((cs.y * cs.y + sin_angle * sin_angle) - 1.0)) {
        ON_2dVector::ON_2dVector((ON_2dVector *)&one_minus_cos_angle,cs.y,sin_angle);
        bVar1 = ON_2dVector::Unitize((ON_2dVector *)&one_minus_cos_angle);
        if (!bVar1) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xform.cpp"
                     ,0x838,"","sin_angle and cos_angle are both zero.");
          cs.y = 1.0;
          cos_angle_local = 0.0;
          goto LAB_009a4cb9;
        }
        cs.y = one_minus_cos_angle;
        cos_angle_local = cs.x;
      }
      if ((0.9999999999999998 < ABS(cs.y)) || (ABS(cos_angle_local) < 2.220446049250313e-16)) {
        cs.y = (double)(~-(ulong)(cs.y < 0.0) & 0x3ff0000000000000 |
                       -(ulong)(cs.y < 0.0) & 0xbff0000000000000);
        cos_angle_local = 0.0;
      }
      else if ((0.9999999999999998 < ABS(cos_angle_local)) || (ABS(cs.y) < 2.220446049250313e-16)) {
        cs.y = 0.0;
        cos_angle_local =
             (double)(~-(ulong)(cos_angle_local < 0.0) & 0x3ff0000000000000 |
                     -(ulong)(cos_angle_local < 0.0) & 0xbff0000000000000);
      }
    }
    else {
      cs.y = (double)(~-(ulong)(cs.y < 0.0) & 0x3ff0000000000000 |
                     -(ulong)(cs.y < 0.0) & 0xbff0000000000000);
      cos_angle_local = 0.0;
    }
  }
  else {
    cs.y = 0.0;
    cos_angle_local =
         (double)(~-(ulong)(sin_angle < 0.0) & 0x3ff0000000000000 |
                 -(ulong)(sin_angle < 0.0) & 0xbff0000000000000);
  }
LAB_009a4cb9:
  if ((((cos_angle_local != 0.0) || (NAN(cos_angle_local))) || (cs.y != 1.0)) || (NAN(cs.y))) {
    a.z = 1.0 - cs.y;
    local_50 = (undefined1  [8])axis.x;
    a.x = axis.y;
    a.y = axis.z;
    dVar2 = ON_3dVector::LengthSquared((ON_3dVector *)local_50);
    if (2.220446049250313e-16 < ABS(dVar2 - 1.0)) {
      ON_3dVector::Unitize((ON_3dVector *)local_50);
    }
    this->m_xform[0][0] = (double)local_50 * (double)local_50 * a.z + cs.y;
    this->m_xform[0][1] = (double)local_50 * a.x * a.z + -(a.y * cos_angle_local);
    this->m_xform[0][2] = (double)local_50 * a.y * a.z + a.x * cos_angle_local;
    this->m_xform[1][0] = a.x * (double)local_50 * a.z + a.y * cos_angle_local;
    this->m_xform[1][1] = a.x * a.x * a.z + cs.y;
    this->m_xform[1][2] = a.x * a.y * a.z + -((double)local_50 * cos_angle_local);
    this->m_xform[2][0] = a.y * (double)local_50 * a.z + -(a.x * cos_angle_local);
    this->m_xform[2][1] = a.y * a.x * a.z + (double)local_50 * cos_angle_local;
    this->m_xform[2][2] = a.y * a.y * a.z + cs.y;
    if ((((center.x != 0.0) || (NAN(center.x))) ||
        ((center.y != 0.0 || ((NAN(center.y) || (center.z != 0.0)))))) || (NAN(center.z))) {
      this->m_xform[0][3] =
           -(this->m_xform[0][2] * center.z +
            (this->m_xform[0][0] - 1.0) * center.x + this->m_xform[0][1] * center.y);
      this->m_xform[1][3] =
           -(this->m_xform[1][2] * center.z +
            this->m_xform[1][0] * center.x + (this->m_xform[1][1] - 1.0) * center.y);
      this->m_xform[2][3] =
           -((this->m_xform[2][2] - 1.0) * center.z +
            this->m_xform[2][0] * center.x + this->m_xform[2][1] * center.y);
    }
    this->m_xform[3][2] = 0.0;
    this->m_xform[3][1] = 0.0;
    this->m_xform[3][0] = 0.0;
    this->m_xform[3][3] = 1.0;
  }
  return;
}

Assistant:

void ON_Xform::Rotation(  
        double sin_angle,
        double cos_angle,
        ON_3dVector axis,
        ON_3dPoint center
        )
{
  *this = ON_Xform::IdentityTransformation;

  for(;;)
  {
    // 29 June 2005 Dale Lear
    //     Kill noise in input
    if ( fabs(sin_angle) >= 1.0-ON_SQRT_EPSILON && fabs(cos_angle) <= ON_SQRT_EPSILON )
    {
      cos_angle = 0.0;
      sin_angle = (sin_angle < 0.0) ? -1.0 : 1.0; 
      break;
    }
    
    if ( fabs(cos_angle) >= 1.0-ON_SQRT_EPSILON && fabs(sin_angle) <= ON_SQRT_EPSILON )
    {
      cos_angle = (cos_angle < 0.0) ? -1.0 : 1.0; 
      sin_angle = 0.0;
      break;
    }
    
    if ( fabs(cos_angle*cos_angle + sin_angle*sin_angle - 1.0) > ON_SQRT_EPSILON )
    {
      ON_2dVector cs(cos_angle,sin_angle);
      if ( cs.Unitize() )
      {
        cos_angle = cs.x;
        sin_angle = cs.y;
        // no break here
      }
      else
      {
        ON_ERROR("sin_angle and cos_angle are both zero.");
        cos_angle = 1.0;
        sin_angle = 0.0;
        break;
      }
    }

    if ( fabs(cos_angle) > 1.0-ON_EPSILON || fabs(sin_angle) < ON_EPSILON )
    {
      cos_angle = (cos_angle < 0.0) ? -1.0 : 1.0; 
      sin_angle = 0.0;
      break;
    }

    if ( fabs(sin_angle) > 1.0-ON_EPSILON || fabs(cos_angle) < ON_EPSILON )
    {
      cos_angle = 0.0;
      sin_angle = (sin_angle < 0.0) ? -1.0 : 1.0; 
      break;
    }

    break;
  }

  if (sin_angle != 0.0 || cos_angle != 1.0) 
  {
    const double one_minus_cos_angle = 1.0 - cos_angle;
    ON_3dVector a = axis;
    if ( fabs(a.LengthSquared() - 1.0) >  ON_EPSILON )
      a.Unitize();

    m_xform[0][0] = a.x*a.x*one_minus_cos_angle + cos_angle;
    m_xform[0][1] = a.x*a.y*one_minus_cos_angle - a.z*sin_angle;
    m_xform[0][2] = a.x*a.z*one_minus_cos_angle + a.y*sin_angle;

    m_xform[1][0] = a.y*a.x*one_minus_cos_angle + a.z*sin_angle;
    m_xform[1][1] = a.y*a.y*one_minus_cos_angle + cos_angle;
    m_xform[1][2] = a.y*a.z*one_minus_cos_angle - a.x*sin_angle;

    m_xform[2][0] = a.z*a.x*one_minus_cos_angle - a.y*sin_angle;
    m_xform[2][1] = a.z*a.y*one_minus_cos_angle + a.x*sin_angle;
    m_xform[2][2] = a.z*a.z*one_minus_cos_angle + cos_angle;

    if ( center.x != 0.0 || center.y != 0.0 || center.z != 0.0 ) {
      m_xform[0][3] = -((m_xform[0][0]-1.0)*center.x + m_xform[0][1]*center.y + m_xform[0][2]*center.z);
      m_xform[1][3] = -(m_xform[1][0]*center.x + (m_xform[1][1]-1.0)*center.y + m_xform[1][2]*center.z);
      m_xform[2][3] = -(m_xform[2][0]*center.x + m_xform[2][1]*center.y + (m_xform[2][2]-1.0)*center.z);
    }

    m_xform[3][0] = m_xform[3][1] = m_xform[3][2] = 0.0;
    m_xform[3][3] = 1.0;
  }
}